

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_addarchive(char *args)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  pcVar2 = strrchr(args,0x20);
  iVar1 = atoi(pcVar2 + 1);
  *pcVar2 = '\0';
  if (*args == '\"') {
    args = args + 1;
    pcVar2[-1] = '\0';
  }
  iVar1 = PHYSFS_mount(args,0,iVar1);
  if (iVar1 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    puts("Successful.");
  }
  return 1;
}

Assistant:

static int cmd_addarchive(char *args)
{
    char *ptr = strrchr(args, ' ');
    int appending = atoi(ptr + 1);
    *ptr = '\0';

    if (*args == '\"')
    {
        args++;
        *(ptr - 1) = '\0';
    } /* if */

    /*printf("[%s], [%d]\n", args, appending);*/

    if (PHYSFS_mount(args, NULL, appending))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}